

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O2

void N_VAbs_MultiFab(N_Vector x,N_Vector z)

{
  uint uVar1;
  FabArray<amrex::FArrayBox> *this;
  FabArray<amrex::FArrayBox> *this_00;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int j;
  long lVar10;
  int k;
  long lVar11;
  long lVar12;
  long lVar13;
  MFIter mfi;
  Box local_12c;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  this = *(FabArray<amrex::FArrayBox> **)((long)x->content + 8);
  this_00 = *(FabArray<amrex::FArrayBox> **)((long)z->content + 8);
  uVar1 = (this->super_FabArrayBase).n_comp;
  amrex::MFIter::MFIter(&local_90,&this->super_FabArrayBase,'\0');
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  while (local_90.currentIndex < local_90.endIndex) {
    amrex::MFIter::validbox(&local_12c,&local_90);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d0,this,&local_90);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_110,this_00,&local_90);
    lVar2 = (long)local_12c.smallend.vect[1];
    lVar6 = (long)local_12c.smallend.vect[2];
    lVar12 = (lVar2 - local_110.begin.y) * local_110.jstride * 8 +
             (lVar6 - local_110.begin.z) * local_110.kstride * 8 +
             (long)local_12c.smallend.vect[0] * 8 + (long)local_110.begin.x * -8 + (long)local_110.p
    ;
    lVar7 = (lVar2 - local_d0.begin.y) * local_d0.jstride * 8 +
            (lVar6 - local_d0.begin.z) * local_d0.kstride * 8 + (long)local_12c.smallend.vect[0] * 8
            + (long)local_d0.begin.x * -8 + (long)local_d0.p;
    for (uVar4 = 0; lVar3 = lVar12, lVar9 = lVar7, lVar11 = lVar6, uVar4 != uVar1; uVar4 = uVar4 + 1
        ) {
      for (; lVar5 = lVar3, lVar10 = lVar2, lVar13 = lVar9, lVar11 <= local_12c.bigend.vect[2];
          lVar11 = lVar11 + 1) {
        for (; lVar10 <= local_12c.bigend.vect[1]; lVar10 = lVar10 + 1) {
          if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
            lVar8 = 0;
            do {
              *(ulong *)(lVar5 + lVar8 * 8) = *(ulong *)(lVar13 + lVar8 * 8) & 0x7fffffffffffffff;
              lVar8 = lVar8 + 1;
            } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 != (int)lVar8);
          }
          lVar5 = lVar5 + local_110.jstride * 8;
          lVar13 = lVar13 + local_d0.jstride * 8;
        }
        lVar3 = lVar3 + local_110.kstride * 8;
        lVar9 = lVar9 + local_d0.kstride * 8;
      }
      lVar12 = lVar12 + local_110.nstride * 8;
      lVar7 = lVar7 + local_d0.nstride * 8;
    }
    amrex::MFIter::operator++(&local_90);
  }
  amrex::MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void N_VAbs_MultiFab(N_Vector x, N_Vector z)
{
    using namespace amrex;

    MultiFab *mf_x = amrex::sundials::getMFptr(x);
    MultiFab *mf_z = amrex::sundials::getMFptr(z);
    sunindextype ncomp = mf_x->nComp();

    // ghost cells not included
    for (MFIter mfi(*mf_x); mfi.isValid(); ++mfi)
    {
         const amrex::Box& bx = mfi.validbox();
         Array4<Real> const& x_fab = mf_x->array(mfi);
         Array4<Real> const& z_fab = mf_z->array(mfi);

         amrex::ParallelFor(bx, ncomp,
         [=] AMREX_GPU_DEVICE (int i, int j, int k, int c) noexcept
         {
             z_fab(i,j,k,c) = SUNRabs(x_fab(i,j,k,c));
         });
    }
}